

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall yactfr::internal::Vm::setFromOther(Vm *this,Vm *other,ElementSequenceIterator *it)

{
  if (this->_dataSrcFactory == other->_dataSrcFactory) {
    this->_it = it;
    VmPos::operator=(&this->_pos,&other->_pos);
    this->_bufAddr = (uint8_t *)0x0;
    this->_bufLenBits = 0;
    this->_bufOffsetInCurPktBits = (this->_pos).headOffsetInCurPktBits;
    return;
  }
  __assert_fail("_dataSrcFactory == other._dataSrcFactory",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.cpp"
                ,0xbd,
                "void yactfr::internal::Vm::setFromOther(const Vm &, ElementSequenceIterator &)");
}

Assistant:

void Vm::setFromOther(const Vm& other, ElementSequenceIterator& it)
{
    assert(_dataSrcFactory == other._dataSrcFactory);
    _it = &it;
    _pos = other._pos;
    this->_resetBuffer();
}